

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagInfoDatabase.cpp
# Opt level: O2

string * __thiscall
TagInfoDatabase::toJson_abi_cxx11_(string *__return_storage_ptr__,TagInfoDatabase *this)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  char *pcVar5;
  bool bVar6;
  TagInfo tagInfo;
  stringstream json;
  TagInfo local_204;
  string *local_200;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{");
  bVar6 = true;
  local_200 = __return_storage_ptr__;
  for (p_Var4 = (this->_tagInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->_tagInformation)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_204._count = p_Var4[2]._M_color;
    bVar2 = TagInfo::hasCount(&local_204);
    if (bVar2) {
      pcVar5 = ",";
      if (bVar6) {
        pcVar5 = "";
      }
      poVar3 = std::operator<<(local_1a8,pcVar5);
      poVar3 = std::operator<<(poVar3,"\n  \"");
      ::json::encode(&local_1d8,(string *)(p_Var4 + 1));
      poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
      poVar3 = std::operator<<(poVar3,"\":");
      TagInfo::toJson_abi_cxx11_(&local_1f8,&local_204);
      std::operator<<(poVar3,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      bVar6 = false;
    }
  }
  std::operator<<(local_1a8,"\n}");
  psVar1 = local_200;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

std::string TagInfoDatabase::toJson ()
{
  std::stringstream json;
  bool first = true;

  json << "{";

  for (auto& pair : _tagInformation)
  {
    auto tagInfo = pair.second;

    if (tagInfo.hasCount ())
    {
      json << (first ? "" : ",")
         << "\n  \"" << json::encode (pair.first) << "\":"
         << tagInfo.toJson ();

      first = (first ? false : first);
    }
  }

  json << "\n}";

  return json.str ();
}